

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_32sto10u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  OPJ_INT32 OVar3;
  ulong uVar4;
  sbyte sVar5;
  int iVar6;
  OPJ_BYTE *pOVar7;
  uint uVar8;
  
  uVar4 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      uVar1 = pSrc[uVar4];
      uVar2 = pSrc[uVar4 + 1];
      uVar8 = pSrc[uVar4 + 2];
      OVar3 = pSrc[uVar4 + 3];
      *pDst = (OPJ_BYTE)(uVar1 >> 2);
      pDst[1] = (byte)(uVar2 >> 4) | (byte)(uVar1 << 6);
      pDst[2] = (byte)(uVar8 >> 6) | (byte)(uVar2 << 4);
      pDst[3] = (byte)((uint)OVar3 >> 8) | (byte)(uVar8 << 2);
      pDst[4] = (OPJ_BYTE)OVar3;
      pDst = pDst + 5;
      uVar4 = uVar4 + 4;
    } while (uVar4 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    uVar1 = pSrc[uVar4];
    iVar6 = (int)(length & 3);
    if (iVar6 == 1) {
      *pDst = (OPJ_BYTE)(uVar1 >> 2);
      pOVar7 = pDst + 1;
      sVar5 = 6;
      uVar8 = uVar1;
    }
    else {
      uVar2 = pSrc[uVar4 + 1];
      uVar8 = 0;
      if (iVar6 == 3) {
        uVar8 = pSrc[uVar4 + 2];
      }
      *pDst = (OPJ_BYTE)(uVar1 >> 2);
      pDst[1] = (byte)(uVar2 >> 4) | (byte)(uVar1 << 6);
      pDst[2] = (byte)(uVar8 >> 6) | (byte)(uVar2 << 4);
      if (iVar6 != 3) {
        return;
      }
      pOVar7 = pDst + 3;
      sVar5 = 2;
    }
    *pOVar7 = (char)uVar8 << sVar5;
  }
  return;
}

Assistant:

static void tif_32sto10u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];

        *pDst++ = (OPJ_BYTE)(src0 >> 2);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3U) << 6) | (src1 >> 4));
        *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 6));
        *pDst++ = (OPJ_BYTE)(((src2 & 0x3FU) << 2) | (src3 >> 8));
        *pDst++ = (OPJ_BYTE)(src3);
    }

    if (length & 3U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        length = length & 3U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
            }
        }
        *pDst++ = (OPJ_BYTE)(src0 >> 2);
        *pDst++ = (OPJ_BYTE)(((src0 & 0x3U) << 6) | (src1 >> 4));
        if (length > 1U) {
            *pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 6));
            if (length > 2U) {
                *pDst++ = (OPJ_BYTE)(((src2 & 0x3FU) << 2));
            }
        }
    }
}